

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void instruct_close(Proc *proc,BasicBlock *block,Scope *scope,uint line_number)

{
  BasicBlock *pBVar1;
  C_MemoryAllocator *pCVar2;
  Instruction *pIVar3;
  int *piVar4;
  undefined1 *ptr;
  Pseudo *index_pseudo;
  PtrListIterator symboliter__;
  PtrListIterator local_40;
  
  pIVar3 = raviX_last_instruction(block);
  if ((pIVar3 == (Instruction *)0x0) || (*(char *)pIVar3 != '\x01')) {
    pBVar1 = proc->current_bb;
    proc->current_bb = block;
    raviX_ptrlist_forward_iterator(&local_40,(PtrList *)scope->symbol_list);
    piVar4 = (int *)raviX_ptrlist_iter_next(&local_40);
    if (piVar4 != (int *)0x0) {
      do {
        if ((*piVar4 == 0) && ((*(byte *)(piVar4 + 0xc) & 1) != 0)) {
          if (*(long *)(piVar4 + 0xe) == 0) {
            __assert_fail("symbol->variable.pseudo",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                          ,0x928,"void instruct_close(Proc *, BasicBlock *, Scope *, unsigned int)")
            ;
          }
          pCVar2 = proc->linearizer->compiler_state->allocator;
          ptr = (undefined1 *)(*pCVar2->calloc)(pCVar2->arena,1,0x28);
          *ptr = 0x5b;
          *(uint *)(ptr + 0x20) = line_number;
          index_pseudo = *(Pseudo **)(piVar4 + 0xe);
          if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
            index_pseudo = indexed_load(proc,index_pseudo);
          }
          raviX_ptrlist_add((PtrList **)(ptr + 8),index_pseudo,
                            proc->linearizer->compiler_state->allocator);
          if (*(BasicBlock **)(ptr + 0x18) != proc->current_bb &&
              *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) {
            __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                          ,0x1b1,"void add_instruction(Proc *, Instruction *)");
          }
          raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                            proc->linearizer->compiler_state->allocator);
          *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
          break;
        }
        piVar4 = (int *)raviX_ptrlist_iter_next(&local_40);
      } while (piVar4 != (int *)0x0);
    }
    proc->current_bb = pBVar1;
  }
  return;
}

Assistant:

static void instruct_close(Proc *proc, BasicBlock *block, Scope *scope, unsigned line_number)
{
	if (is_already_closed(proc, block))
		return;
	/* temporarily make block current */
	BasicBlock *prev_current = proc->current_bb;
	proc->current_bb = block;

	LuaSymbol *symbol;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, symbol)
	{
		/* We add the first escaping variable as the operand to op_close.
		 * op_close is meant to scan the stack from that point and close
		 * any open upvalues
		 */
		if (symbol->symbol_type == SYM_LOCAL && symbol->variable.escaped) {
			assert(symbol->variable.pseudo);
			Instruction *insn = allocate_instruction(proc, op_close, line_number);
			add_instruction_operand(proc, insn, symbol->variable.pseudo);
			add_instruction(proc, insn);
			break;
		}
	}
	END_FOR_EACH_PTR(symbol)
	
	/* restore current basic block */
	proc->current_bb = prev_current;
}